

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O3

void CharConvSW(charconv *CC,char *Out,size_t OutLen,wchar_t *In)

{
  wchar_t wVar1;
  size_t sVar2;
  char *_Out;
  size_t _OutLen;
  size_t _InLen;
  char *_In;
  char *local_40;
  size_t local_38;
  size_t local_30;
  wchar_t *local_28;
  
  if (OutLen != 0) {
    local_28 = In;
    local_30 = wcslen(In);
    local_30 = local_30 + 1;
    local_40 = Out;
    local_38 = OutLen;
    if (((local_30 == 0 || CC == (charconv *)0x0) ||
        (sVar2 = iconv(CC,(char **)&local_28,&local_30,&local_40,&local_38),
        sVar2 == 0xffffffffffffffff)) ||
       (sVar2 = iconv(CC,(char **)0x0,(size_t *)0x0,&local_40,&local_38),
       sVar2 == 0xffffffffffffffff)) {
      if (OutLen != 1) {
        do {
          wVar1 = *In;
          if (wVar1 == L'\0') break;
          if (L'ÿ' < wVar1) {
            wVar1 = L'*';
          }
          *Out = (char)wVar1;
          In = In + 1;
          OutLen = OutLen - 1;
          Out = Out + 1;
        } while (1 < OutLen);
      }
      *Out = '\0';
      if ((CC != (charconv *)0x0) && (local_30 != 0)) {
        iconv(CC,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      }
    }
    else {
      *local_40 = '\0';
    }
  }
  return;
}

Assistant:

void CharConvSW(charconv* CC, char* Out, size_t OutLen, const wchar_t* In)
{
    if (OutLen>0)
    {
        ICONV_CONST char* _In = (ICONV_CONST char*)In;
        size_t _InLen = wcslen(In)+1;
        char* _Out = Out;
        size_t _OutLen = OutLen;

        if (!CC || !_InLen || iconv((iconv_t)CC, &_In, &_InLen, &_Out, &_OutLen) == (size_t)-1 ||
                    iconv((iconv_t)CC, NULL, NULL, &_Out, &_OutLen) == (size_t)-1)
        {
            for (;OutLen>1 && *In;++In,--OutLen,++Out)
                *Out = (char)(*In>255?'*':*In);
            *Out = 0;
            if (CC && _InLen) iconv((iconv_t)CC, NULL, NULL, NULL, NULL); // reset state
        }
        else
            *_Out=0;
    }
}